

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

bool __thiscall QToolBarPrivate::mouseMoveEvent(QToolBarPrivate *this,QMouseEvent *event)

{
  bool bVar1;
  Orientation OVar2;
  int iVar3;
  DragState *pDVar4;
  QWidget *this_00;
  QLayoutItem *hoverTarget;
  QWidgetData *pQVar5;
  Representation RVar6;
  undefined4 uVar7;
  uint uVar8;
  LayoutDirection LVar9;
  int iVar10;
  QMainWindow *mainWindow;
  QMainWindowLayout *this_01;
  QPoint QVar11;
  QWidget *pQVar12;
  QWindow *context;
  undefined8 uVar13;
  QRect *pQVar14;
  ulong uVar15;
  DragState *pDVar16;
  Representation *pRVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  int iVar19;
  int iVar25;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar26;
  undefined1 auVar24 [16];
  int iVar27;
  int iVar29;
  double extraout_XMM1_Qa;
  double dVar28;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  QPointF QVar33;
  QPoint globalPressPos;
  QPoint rtl;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  undefined1 local_48 [16];
  QLayoutItem *local_38;
  
  local_38 = *(QLayoutItem **)(in_FS_OFFSET + 0x28);
  pDVar4 = this->state;
  if (pDVar4 == (DragState *)0x0) goto LAB_004b5417;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  mainWindow = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
  if (mainWindow == (QMainWindow *)0x0) goto LAB_004b5417;
  this_01 = qt_mainwindow_layout(mainWindow);
  if (this_01->pluggingWidget == (QWidget *)0x0) {
    auVar32 = QEventPoint::position();
    auVar20._0_8_ =
         (double)((ulong)auVar32._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar32._0_8_;
    auVar20._8_8_ =
         (double)((ulong)auVar32._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar32._8_8_;
    auVar20 = minpd(_DAT_0066f5d0,auVar20);
    auVar20 = maxpd(auVar20,_DAT_0066f5e0);
    QVar11 = this->state->pressPos;
    iVar19 = (int)auVar20._0_8_ - QVar11.xp.m_i;
    iVar25 = (int)auVar20._8_8_ - QVar11.yp.m_i;
    iVar27 = iVar19 >> 0x1f;
    iVar29 = iVar25 >> 0x1f;
    uVar15 = CONCAT44(iVar25,iVar19) ^ CONCAT44(iVar29,iVar27);
    iVar19 = QApplication::startDragDistance();
    if (iVar19 < ((int)(uVar15 >> 0x20) - iVar29) + ((int)uVar15 - iVar27)) {
      bVar1 = this->state->dragging;
      if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        OVar2 = this->orientation;
        QVar33 = (QPointF)QEventPoint::position();
        if (OVar2 == Vertical) {
          local_48 = (undefined1  [16])QVar33;
          QVar11 = QPointF::toPoint((QPointF *)local_48);
          if (QVar11.xp.m_i.m_i < 0) goto LAB_004b5099;
          local_58 = (QPointF)QEventPoint::position();
          QVar11 = QPointF::toPoint(&local_58);
          RVar6 = QVar11.xp.m_i;
          pQVar14 = &this_00->data->crect;
          pRVar17 = &(this_00->data->crect).x2;
        }
        else {
          local_68 = QVar33;
          QVar11 = QPointF::toPoint(&local_68);
          if ((long)QVar11 < 0) goto LAB_004b5099;
          local_78 = (QPointF)QEventPoint::position();
          QVar11 = QPointF::toPoint(&local_78);
          RVar6 = QVar11.yp.m_i;
          pRVar17 = &(this_00->data->crect).y2;
          pQVar14 = (QRect *)&(this_00->data->crect).y1;
        }
        iVar19 = (pRVar17->m_i - (pQVar14->x1).m_i) + 1;
        startDrag(this,RVar6.m_i < iVar19);
        if (iVar19 <= RVar6.m_i && (bVar1 & 1U) == 0) {
LAB_004b50a8:
          QWidget::grabMouse(this_00);
        }
      }
      else {
LAB_004b5099:
        startDrag(this,false);
        if (bVar1 == false) goto LAB_004b50a8;
      }
    }
  }
  pDVar16 = this->state;
  if (pDVar16 == (DragState *)0x0) {
    QWidget::releaseMouse(this_00);
    goto LAB_004b5417;
  }
  if (pDVar16->dragging == true) {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uVar7 = QEventPoint::globalPosition();
    auVar32._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar32._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar20 = minpd(_DAT_0066f5d0,auVar32);
    auVar21._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
    auVar21._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
    uVar8 = movmskpd(uVar7,auVar21);
    uVar18 = (ulong)(uint)(int)auVar20._8_8_;
    uVar15 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
    if ((uVar8 & 1) == 0) {
      uVar15 = 0x8000000000000000;
    }
    if ((uVar8 & 2) == 0) {
      uVar18 = 0x80000000;
    }
    local_48._0_8_ = uVar18 | uVar15;
    LVar9 = QWidget::layoutDirection(this_00);
    pDVar16 = this->state;
    iVar19 = (pDVar16->pressPos).xp.m_i;
    if (LVar9 == LeftToRight) {
      iVar19 = -iVar19;
      iVar25 = (pDVar16->pressPos).yp.m_i;
    }
    else {
      iVar19 = iVar19 + ~(this_00->data->crect).x2.m_i + (this_00->data->crect).x1.m_i;
      iVar25 = (pDVar16->pressPos).yp.m_i;
    }
    local_48._4_4_ = local_48._4_4_ - iVar25;
    local_48._0_4_ = local_48._0_4_ + iVar19;
    QWidget::move(this_00,(QPoint *)local_48);
    uVar7 = SUB84(pDVar16,0);
    hoverTarget = this->state->widgetItem;
    auVar20 = QEventPoint::globalPosition();
    auVar22._0_8_ =
         (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._8_8_;
    auVar22._8_8_ =
         (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._0_8_;
    auVar20 = minpd(_DAT_0066f5d0,auVar22);
    auVar23._8_8_ = -(ulong)(-2147483648.0 < auVar20._8_8_);
    auVar23._0_8_ = -(ulong)(-2147483648.0 < auVar20._0_8_);
    uVar8 = movmskpd(uVar7,auVar23);
    uVar15 = 0x8000000000000000;
    if ((uVar8 & 1) != 0) {
      uVar15 = (ulong)(uint)(int)auVar20._0_8_ << 0x20;
    }
    uVar18 = 0x80000000;
    if ((uVar8 & 2) != 0) {
      uVar18 = (ulong)(uint)(int)auVar20._8_8_;
    }
    local_58.xp = (qreal)(uVar18 | uVar15);
    QMainWindowLayout::hover((QMainWindowLayout *)this_01,hoverTarget,(QPoint *)&local_58);
    goto LAB_004b5417;
  }
  if (pDVar16->moving != true) goto LAB_004b5417;
  local_48._4_4_ = (pDVar16->pressPos).yp.m_i;
  local_48._0_4_ =
       ((this_00->data->crect).x2.m_i - ((this_00->data->crect).x1.m_i + (pDVar16->pressPos).xp.m_i)
       ) + 1;
  local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  LVar9 = QWidget::layoutDirection(this_00);
  if (LVar9 == RightToLeft) {
    pDVar16 = (DragState *)local_48;
  }
  else {
    pDVar16 = this->state;
  }
  local_58.xp = (qreal)QWidget::mapToGlobal(this_00,&pDVar16->pressPos);
  pQVar12 = QWidget::window(this_00);
  if (pQVar12 == (QWidget *)0x0) {
    context = (QWindow *)0x0;
  }
  else {
    pQVar12 = QWidget::window(this_00);
    context = QWidget::windowHandle(pQVar12);
  }
  auVar20 = QEventPoint::globalPosition();
  dVar30 = auVar20._8_8_;
  dVar28 = auVar20._0_8_;
  if (context == (QWindow *)0x0) {
    auVar31._0_8_ = (double)((ulong)dVar28 & 0x8000000000000000 | 0x3fe0000000000000) + dVar28;
    auVar31._8_8_ = (double)((ulong)dVar30 & 0x8000000000000000 | 0x3fe0000000000000) + dVar30;
    auVar20 = minpd(_DAT_0066f5d0,auVar31);
    auVar20 = maxpd(auVar20,_DAT_0066f5e0);
    dVar28 = auVar20._0_8_;
    dVar30 = auVar20._8_8_;
    QVar11 = (QPoint)local_58.xp;
  }
  else {
    uVar13 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
    QVar11 = QHighDpi::fromNativePixels<QPoint,QWindow>((QPoint *)&local_58,context);
    dVar26 = (double)(int)((ulong)uVar13 >> 0x20);
    dVar28 = (1.0 / extraout_XMM0_Qa_00) * (dVar28 - (double)(int)uVar13) + (double)(int)uVar13;
    dVar26 = (1.0 / extraout_XMM0_Qa_00) * (dVar30 - dVar26) + dVar26;
    auVar24._0_8_ = (double)((ulong)dVar28 & 0x8000000000000000 | 0x3fe0000000000000) + dVar28;
    auVar24._8_8_ = (double)((ulong)dVar26 & 0x8000000000000000 | 0x3fe0000000000000) + dVar26;
    auVar20 = minpd(_DAT_0066f5d0,auVar24);
    auVar20 = maxpd(auVar20,_DAT_0066f5e0);
    dVar28 = auVar20._0_8_;
    dVar30 = auVar20._8_8_;
  }
  iVar19 = (int)dVar28 - QVar11.xp.m_i;
  if (this->orientation == Vertical) {
    iVar25 = QWidget::y(this_00);
    iVar19 = (int)dVar30 - QVar11.yp.m_i;
LAB_004b5403:
    iVar25 = iVar25 + iVar19;
  }
  else {
    LVar9 = QWidget::layoutDirection(this_00);
    if (LVar9 != RightToLeft) {
      iVar25 = QWidget::x(this_00);
      goto LAB_004b5403;
    }
    pQVar5 = (mainWindow->super_QWidget).data;
    iVar25 = (pQVar5->crect).x2.m_i;
    iVar27 = (pQVar5->crect).x1.m_i;
    iVar29 = (this_00->data->crect).x2.m_i;
    iVar3 = (this_00->data->crect).x1.m_i;
    iVar10 = QWidget::x(this_00);
    iVar25 = (iVar25 + iVar3) - (iVar10 + iVar19 + iVar27 + iVar29);
  }
  QMainWindowLayout::moveToolBar((QMainWindowLayout *)this_01,(QToolBar *)this_00,iVar25);
LAB_004b5417:
  if (*(QLayoutItem **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pDVar4 != (DragState *)0x0;
}

Assistant:

bool QToolBarPrivate::mouseMoveEvent(QMouseEvent *event)
{
    Q_Q(QToolBar);

    if (!state) {
#ifdef Q_OS_MACOS
        if (!macWindowDragging)
            return false;
        QWidget *w = q->window();
        const QPoint delta = event->pos() - macWindowDragPressPosition;
        w->move(w->pos() + delta);
        return true;
#endif
        return false;
    }

    QMainWindow *win = qobject_cast<QMainWindow*>(parent);
    if (win == nullptr)
        return true;

    QMainWindowLayout *layout = qt_mainwindow_layout(win);
    Q_ASSERT(layout != nullptr);

    if (layout->pluggingWidget == nullptr
        && (event->position().toPoint() - state->pressPos).manhattanLength() > QApplication::startDragDistance()) {
            const bool wasDragging = state->dragging;
            const bool moving = !q->isWindow() && (orientation == Qt::Vertical ?
                event->position().toPoint().x() >= 0 && event->position().toPoint().x() < q->width() :
                event->position().toPoint().y() >= 0 && event->position().toPoint().y() < q->height());

            startDrag(moving);
            if (!moving && !wasDragging)
                q->grabMouse();
    }

    if (!state) {
        q->releaseMouse();
        return true;
    }

    if (state->dragging) {
        QPoint pos = event->globalPosition().toPoint();
        // if we are right-to-left, we move so as to keep the right edge the same distance
        // from the mouse
        if (q->isLeftToRight())
            pos -= state->pressPos;
        else
            pos += QPoint(state->pressPos.x() - q->width(), -state->pressPos.y());

        q->move(pos);
        layout->hover(state->widgetItem, event->globalPosition().toPoint());
    } else if (state->moving) {

        const QPoint rtl(q->width() - state->pressPos.x(), state->pressPos.y()); //for RTL
        const QPoint globalPressPos = q->mapToGlobal(q->isRightToLeft() ? rtl : state->pressPos);
        int pos = 0;

        const QWindow *handle = q->window() ? q->window()->windowHandle() : nullptr;
        const QPoint delta = handle
                ? QHighDpi::fromNativePixels(event->globalPosition(), handle).toPoint()
                  - QHighDpi::fromNativePixels(globalPressPos, handle)
                : event->globalPosition().toPoint() - globalPressPos;

        if (orientation == Qt::Vertical) {
            pos = q->y() + delta.y();
        } else {
            if (q->isRightToLeft()) {
                pos = win->width() - q->width() - q->x()  - delta.x();
            } else {
                pos = q->x() + delta.x();
            }
        }

        layout->moveToolBar(q, pos);
    }
    return true;
}